

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::expectQuitSystem(SDLGraphicsSystemTests *this)

{
  PtrDeleterMock *pPVar1;
  MockSpec<void_(SDL_Renderer_*)> *this_00;
  MockSpec<void_(SDL_Window_*)> *this_01;
  StrictMock<solitaire::SDL::WrapperMock> *__return_storage_ptr__;
  MockSpec<void_()> *this_02;
  char *this_03;
  WithoutMatchers local_a9;
  MockSpec<void_()> local_a8;
  WithoutMatchers local_91;
  Matcher<SDL_Window_*> local_90;
  MockSpec<void_(SDL_Window_*)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<SDL_Renderer_*> local_48;
  MockSpec<void_(SDL_Renderer_*)> local_30;
  SDLGraphicsSystemTests *local_10;
  SDLGraphicsSystemTests *this_local;
  
  local_10 = this;
  pPVar1 = &std::
            __shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ptrDeleterMock)->super_PtrDeleterMock;
  testing::Matcher<SDL_Renderer_*>::Matcher(&local_48,(Snapshot *)0x2);
  SDL::PtrDeleterMock::gmock_rendererDeleter(&local_30,pPVar1,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<void_(SDL_Renderer_*)>::operator()
                      (&local_30,local_55,(void *)0x0);
  testing::internal::MockSpec<void_(SDL_Renderer_*)>::InternalExpectedAt
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x71,"*ptrDeleterMock","rendererDeleter(rendererPtr)");
  testing::internal::MockSpec<void_(SDL_Renderer_*)>::~MockSpec(&local_30);
  testing::Matcher<SDL_Renderer_*>::~Matcher(&local_48);
  pPVar1 = &std::
            __shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ptrDeleterMock)->super_PtrDeleterMock;
  testing::Matcher<SDL_Window_*>::Matcher(&local_90,(Snapshot *)0x1);
  SDL::PtrDeleterMock::gmock_windowDeleter(&local_78,pPVar1,&local_90);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(SDL_Window_*)>::operator()
                      (&local_78,&local_91,(void *)0x0);
  this_03 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
  ;
  testing::internal::MockSpec<void_(SDL_Window_*)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x72,"*ptrDeleterMock","windowDeleter(windowPtr)");
  testing::internal::MockSpec<void_(SDL_Window_*)>::~MockSpec(&local_78);
  testing::Matcher<SDL_Window_*>::~Matcher(&local_90);
  __return_storage_ptr__ =
       mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*(&this->sdlMock);
  local_a8.function_mocker_ =
       (FunctionMocker<void_()> *)
       SDL::WrapperMock::gmock_quit
                 ((MockSpec<void_()> *)__return_storage_ptr__,(WrapperMock *)this_03);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_()>::operator()(&local_a8,&local_a9,(void *)0x0);
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            (this_02,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x73,"*sdlMock","quit()");
  return;
}

Assistant:

void expectQuitSystem() {
        EXPECT_CALL(*ptrDeleterMock, rendererDeleter(rendererPtr));
        EXPECT_CALL(*ptrDeleterMock, windowDeleter(windowPtr));
        EXPECT_CALL(*sdlMock, quit());
    }